

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock.c
# Opt level: O3

void rwlock_lock_write(RWLock *rwlock)

{
  atomic_int_fast32_t *paVar1;
  long lVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)rwlock);
  LOCK();
  paVar1 = &rwlock->num_pending;
  lVar2 = *paVar1;
  *paVar1 = *paVar1 + -0x40000000;
  UNLOCK();
  if (lVar2 != 0) {
    LOCK();
    paVar1 = &rwlock->readers_departing;
    *paVar1 = *paVar1 + lVar2;
    UNLOCK();
    if (*paVar1 != 0) {
      sem_wait_nointr(&rwlock->writer_wait);
      return;
    }
  }
  return;
}

Assistant:

void
rwlock_lock_write(RWLock *rwlock)
{
	(void)pthread_mutex_lock(&rwlock->mutex);
	int_fast32_t r = atomic_fetch_sub(&rwlock->num_pending, MAX_READERS);
	if (r != 0 &&
	    atomic_fetch_add(&rwlock->readers_departing, r) + r != 0) {
		(void)sem_wait_nointr(&rwlock->writer_wait);
	}
}